

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int nscmp(lyd_node *node1,lyd_node *node2)

{
  lys_module *plVar1;
  lys_module *plVar2;
  
  plVar1 = lys_node_module(node1->schema);
  plVar2 = lys_node_module(node2->schema);
  return (int)(plVar1 != plVar2);
}

Assistant:

int
nscmp(const struct lyd_node *node1, const struct lyd_node *node2)
{
    /* we have to cover submodules belonging to the same module */
    if (lys_node_module(node1->schema) == lys_node_module(node2->schema)) {
        /* belongs to the same module */
        return 0;
    } else {
        /* different modules */
        return 1;
    }
}